

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# scene.cpp
# Opt level: O2

void update(float dt)

{
  int numKeys;
  cgltf_animation_path_type cVar1;
  cgltf_animation *pcVar2;
  cgltf_animation_sampler *pcVar3;
  cgltf_animation_sampler *pcVar4;
  quat *pqVar5;
  cgltf_size cVar6;
  ulong uVar7;
  int *piVar8;
  float *pfVar9;
  long lVar10;
  size_t sVar11;
  NodeData *pNVar12;
  undefined8 *puVar13;
  undefined8 *puVar14;
  long lVar15;
  qua<float,_(glm::qualifier)0> *y;
  cgltf_node *node;
  size_t i;
  cgltf_animation_channel *pcVar16;
  cgltf_node *node_00;
  int iVar17;
  vec3 *pvVar18;
  bool bVar19;
  float fVar20;
  float fVar21;
  float timeA;
  float fVar22;
  float fVar23;
  vec<3,_float,_(glm::qualifier)0> vVar24;
  qua<float,_(glm::qualifier)0> qVar25;
  anon_class_8_1_f28172e8 local_98;
  anon_class_8_1_f28172e8 accessInput;
  anon_union_4_3_4e90da17_for_vec<4,_float,_(glm::qualifier)0>_3 local_88;
  undefined4 uStack_84;
  undefined4 uStack_80;
  undefined4 uStack_7c;
  undefined4 uStack_78;
  undefined4 local_74;
  undefined8 local_70;
  undefined8 uStack_68;
  undefined4 local_60;
  undefined8 local_5c;
  undefined8 uStack_54;
  undefined4 local_4c;
  qua<float,_(glm::qualifier)0> local_48;
  
  uVar7 = DAT_0032c990;
  if (parsedData != (cgltf_data *)0x0) {
    lVar15 = (long)anims::playingInd;
    if (0 < lVar15) {
      pcVar2 = parsedData->animations;
      anims::time = fmodf(dt + anims::time,anims::duration);
      if ((anims::time < 0.0) || (anims::duration <= anims::time)) {
        __assert_fail("time >= 0 && time < duration",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/tuket[P]gltf_viewer/src/scene.cpp"
                      ,0x1eb,"void anims::update(float)");
      }
      i = 0;
      sVar11 = uVar7 & 0xffffffff;
      if ((int)uVar7 < 1) {
        sVar11 = i;
      }
LAB_0011209e:
      if (i != sVar11) {
        pcVar3 = pcVar2[lVar15 + -1].samplers;
        pcVar4 = pcVar3 + i;
        piVar8 = tl::Vector<int>::operator[]((Vector<int> *)&anims::curKeyInds,i);
        cVar6 = (pcVar3[i].input)->count;
        iVar17 = *piVar8;
        do {
          if (iVar17 == -1) {
            pfVar9 = (float *)cgltfAccessAccessor(pcVar4->input,0);
            if (anims::time < *pfVar9) goto LAB_00112161;
LAB_00112154:
            iVar17 = *piVar8 + 1;
          }
          else {
            pfVar9 = (float *)cgltfAccessAccessor(pcVar4->input,(long)iVar17);
            fVar20 = *pfVar9;
            bVar19 = iVar17 == (int)cVar6 + -1;
            iVar17 = -1;
            if (bVar19) {
              if (fVar20 <= anims::time) goto LAB_00112161;
            }
            else {
              pfVar9 = (float *)cgltfAccessAccessor(pcVar4->input,(long)*piVar8 + 1);
              if (fVar20 <= anims::time) {
                if (*pfVar9 <= anims::time) goto LAB_00112154;
                goto LAB_00112161;
              }
            }
          }
          *piVar8 = iVar17;
        } while( true );
      }
      pcVar16 = pcVar2[lVar15 + -1].channels;
      for (lVar10 = pcVar2[lVar15 + -1].channels_count * 0x28; lVar10 != 0; lVar10 = lVar10 + -0x28)
      {
        pcVar4 = pcVar16->sampler;
        sVar11 = ((long)pcVar16->target_node - (long)parsedData->nodes) / 0xd8;
        piVar8 = tl::Vector<int>::operator[]
                           ((Vector<int> *)&anims::curKeyInds,
                            ((long)pcVar4 - (long)pcVar2[lVar15 + -1].samplers) / 0x28);
        iVar17 = *piVar8;
        numKeys = (int)pcVar4->input->count;
        cVar1 = pcVar16->target_path;
        if (cVar1 == cgltf_animation_path_type_scale) {
          pNVar12 = tl::Vector<anims::NodeData>::operator[]
                              ((Vector<anims::NodeData> *)&anims::nodesData,sVar11);
          pvVar18 = pNVar12->scale;
          if (pvVar18 == (vec3 *)0x0) {
            __assert_fail("&scale",
                          "/workspace/llm4binary/github/license_all_cmakelists_25/tuket[P]gltf_viewer/src/scene.cpp"
                          ,0x22c,"void anims::update(float)");
          }
LAB_0011227a:
          vVar24 = anims::interpolateAnim<glm::vec<3,float,(glm::qualifier)0>>
                             (pcVar4->interpolation,pcVar4,iVar17,numKeys);
          pvVar18->field_0 =
               (anon_union_4_3_4e90da17_for_vec<3,_float,_(glm::qualifier)0>_3)(int)vVar24._0_8_;
          pvVar18->field_1 =
               (anon_union_4_3_4e90b0ec_for_vec<3,_float,_(glm::qualifier)0>_5)
               (int)((ulong)vVar24._0_8_ >> 0x20);
          pvVar18->field_2 = vVar24.field_2;
        }
        else {
          if (cVar1 != cgltf_animation_path_type_rotation) {
            if (cVar1 != cgltf_animation_path_type_translation) {
              __assert_fail("false",
                            "/workspace/llm4binary/github/license_all_cmakelists_25/tuket[P]gltf_viewer/src/scene.cpp"
                            ,0x231,"void anims::update(float)");
            }
            pNVar12 = tl::Vector<anims::NodeData>::operator[]
                                ((Vector<anims::NodeData> *)&anims::nodesData,sVar11);
            pvVar18 = pNVar12->position;
            if (pvVar18 == (vec3 *)0x0) {
              __assert_fail("&pos",
                            "/workspace/llm4binary/github/license_all_cmakelists_25/tuket[P]gltf_viewer/src/scene.cpp"
                            ,0x220,"void anims::update(float)");
            }
            goto LAB_0011227a;
          }
          pNVar12 = tl::Vector<anims::NodeData>::operator[]
                              ((Vector<anims::NodeData> *)&anims::nodesData,sVar11);
          pqVar5 = pNVar12->rotation;
          if (pqVar5 == (quat *)0x0) {
            __assert_fail("&rot",
                          "/workspace/llm4binary/github/license_all_cmakelists_25/tuket[P]gltf_viewer/src/scene.cpp"
                          ,0x226,"void anims::update(float)");
          }
          local_98.sampler = pcVar4;
          accessInput.sampler = pcVar4;
          if (pcVar4->interpolation == cgltf_interpolation_type_linear) {
            if (iVar17 == -1) {
              iVar17 = 0;
              goto LAB_001122ce;
            }
            puVar13 = (undefined8 *)
                      anims::interpolateAnim<glm::qua<float,_(glm::qualifier)0>_>::
                      anon_class_8_1_f28172e8::operator()(&local_98,iVar17);
            if (numKeys + -1 == iVar17) {
              fVar20 = (float)*puVar13;
              fVar21 = (float)((ulong)*puVar13 >> 0x20);
              fVar22 = (float)puVar13[1];
              fVar23 = (float)((ulong)puVar13[1] >> 0x20);
            }
            else {
              puVar14 = (undefined8 *)
                        anims::interpolateAnim<glm::qua<float,_(glm::qualifier)0>_>::
                        anon_class_8_1_f28172e8::operator()(&local_98,iVar17 + 1);
              pfVar9 = (float *)anims::interpolateAnim<glm::qua<float,_(glm::qualifier)0>_>::
                                anon_class_8_1_f28172e8::operator()(&accessInput,iVar17);
              fVar20 = *pfVar9;
              pfVar9 = (float *)anims::interpolateAnim<glm::qua<float,_(glm::qualifier)0>_>::
                                anon_class_8_1_f28172e8::operator()(&accessInput,iVar17 + 1);
              local_88 = SUB84(*puVar13,0);
              uStack_84 = (undefined4)((ulong)*puVar13 >> 0x20);
              uStack_80 = (undefined4)puVar13[1];
              uStack_7c = (undefined4)((ulong)puVar13[1] >> 0x20);
              local_48._0_8_ = *puVar14;
              local_48._8_8_ = puVar14[1];
              qVar25 = glm::slerp<float,(glm::qualifier)0>
                                 ((glm *)&local_88,&local_48,y,
                                  (anims::time - fVar20) / (*pfVar9 - fVar20));
              fVar22 = qVar25.z;
              fVar23 = qVar25.w;
              fVar20 = qVar25.x;
              fVar21 = qVar25.y;
            }
          }
          else {
            if (pcVar4->interpolation != cgltf_interpolation_type_step) {
              __assert_fail("false && \"not implemented\"",
                            "/workspace/llm4binary/github/license_all_cmakelists_25/tuket[P]gltf_viewer/src/scene.cpp"
                            ,0x1dc,
                            "T anims::interpolateAnim(cgltf_interpolation_type, const cgltf_animation_sampler &, i32, i32) [T = glm::qua<float>]"
                           );
            }
            if (iVar17 < 1) {
              iVar17 = 0;
            }
            if (numKeys < iVar17) {
              iVar17 = numKeys;
            }
LAB_001122ce:
            puVar13 = (undefined8 *)
                      anims::interpolateAnim<glm::qua<float,_(glm::qualifier)0>_>::
                      anon_class_8_1_f28172e8::operator()(&local_98,iVar17);
            fVar20 = (float)*puVar13;
            fVar21 = (float)((ulong)*puVar13 >> 0x20);
            fVar22 = (float)puVar13[1];
            fVar23 = (float)((ulong)puVar13[1] >> 0x20);
          }
          pqVar5->x = fVar20;
          pqVar5->y = fVar21;
          pqVar5->z = fVar22;
          pqVar5->w = fVar23;
        }
        pcVar16 = pcVar16 + 1;
      }
    }
    tl::Vector<glm::mat<4,_4,_float,_(glm::qualifier)0>_>::resize<>
              ((Vector<glm::mat<4,_4,_float,_(glm::qualifier)0>_> *)anims::nodesMatrices,
               parsedData->nodes_count);
    node_00 = parsedData->nodes;
    for (lVar15 = parsedData->nodes_count * 0xd8; lVar15 != 0; lVar15 = lVar15 + -0xd8) {
      if (node_00->parent == (cgltf_node *)0x0) {
        local_88.x = 1.0;
        uStack_84 = 0;
        uStack_80 = 0;
        uStack_7c = 0;
        uStack_78 = 0;
        local_74 = 0x3f800000;
        local_70 = 0;
        uStack_68 = 0;
        local_60 = 0x3f800000;
        local_5c = 0;
        uStack_54 = 0;
        local_4c = 0x3f800000;
        calcNodesMatricesRecursive(node_00,(mat4 *)&local_88);
      }
      node_00 = node_00 + 1;
    }
  }
  return;
LAB_00112161:
  i = i + 1;
  goto LAB_0011209e;
}

Assistant:

void update(float dt)
{
    if(!parsedData)
        return;

    anims::update(dt);

    anims::nodesMatrices.resize(parsedData->nodes_count);
    for(const cgltf_node& node : getNodes())
        if(node.parent == nullptr)
            calcNodesMatricesRecursive(node);
}